

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O0

void __thiscall ki::protocol::dml::MessageManager::~MessageManager(MessageManager *this)

{
  MessageModule *this_00;
  bool bVar1;
  reference ppMVar2;
  __normal_iterator<ki::protocol::dml::MessageModule_**,_std::vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>_>
  local_20;
  __normal_iterator<ki::protocol::dml::MessageModule_**,_std::vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>_>
  local_18;
  iterator it;
  MessageManager *this_local;
  
  it._M_current = (MessageModule **)this;
  local_18._M_current =
       (MessageModule **)
       std::
       vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
       ::begin(&this->m_modules);
  while( true ) {
    local_20._M_current =
         (MessageModule **)
         std::
         vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>
         ::end(&this->m_modules);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppMVar2 = __gnu_cxx::
              __normal_iterator<ki::protocol::dml::MessageModule_**,_std::vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppMVar2;
    if (this_00 != (MessageModule *)0x0) {
      MessageModule::~MessageModule(this_00);
      operator_delete(this_00);
    }
    __gnu_cxx::
    __normal_iterator<ki::protocol::dml::MessageModule_**,_std::vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>_>
    ::operator++(&local_18);
  }
  std::
  vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>::
  clear(&this->m_modules);
  std::
  map<unsigned_char,_ki::protocol::dml::MessageModule_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
  ::clear(&this->m_service_id_map);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
  ::clear(&this->m_protocol_type_map);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::protocol::dml::MessageModule_*>_>_>
  ::~map(&this->m_protocol_type_map);
  std::
  map<unsigned_char,_ki::protocol::dml::MessageModule_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_ki::protocol::dml::MessageModule_*>_>_>
  ::~map(&this->m_service_id_map);
  std::
  vector<ki::protocol::dml::MessageModule_*,_std::allocator<ki::protocol::dml::MessageModule_*>_>::
  ~vector(&this->m_modules);
  return;
}

Assistant:

MessageManager::~MessageManager()
	{
		for (auto it = m_modules.begin();
			it != m_modules.end(); ++it)
			delete *it;
		m_modules.clear();
		m_service_id_map.clear();
		m_protocol_type_map.clear();
	}